

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

idx_t duckdb_struct_type_child_count(duckdb_logical_type type)

{
  idx_t iVar1;
  
  if ((type != (duckdb_logical_type)0x0) && (type[1] == (_duckdb_logical_type)0x18)) {
    iVar1 = duckdb::StructType::GetChildCount((LogicalType *)type);
    return iVar1;
  }
  return 0;
}

Assistant:

static bool AssertInternalType(duckdb_logical_type type, duckdb::PhysicalType physical_type) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.InternalType() != physical_type) {
		return false;
	}
	return true;
}